

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall UnifiedRegex::CharSetInner::Get(CharSetInner *this,uint level,uint k)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  uint i;
  uint k_local;
  uint level_local;
  CharSetInner *this_local;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x21e,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  uVar3 = CharSetNode::innerIdx(level,k);
  if (this->children[uVar3] == (CharSetNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar4 = (*this->children[uVar3]->_vptr_CharSetNode[5])
                      (this->children[uVar3],(ulong)(level - 1),(ulong)k);
    this_local._7_1_ = (bool)((byte)iVar4 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool CharSetInner::Get(uint level, uint k) const
    {
        Assert(level > 0);
        uint i = innerIdx(level--, k);
        if (children[i] == nullptr)
            return false;
        else
            return children[i]->Get(level, k);
    }